

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

int __thiscall
common::Config::GetHosts
          (Config *this,string *group,string *tag,
          vector<common::Host,_std::allocator<common::Host>_> *hosts)

{
  element_type *peVar1;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer psVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  long lVar7;
  ulong uVar8;
  string *local_38;
  
  psVar6 = (this->m_hosts).
           super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_hosts).
      super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == psVar6) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    uVar8 = 0;
    do {
      peVar1 = psVar6[uVar8].super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      __n = (peVar1->group)._M_string_length;
      if ((__n == group->_M_string_length) &&
         ((__n == 0 ||
          (iVar4 = bcmp((peVar1->group)._M_dataplus._M_p,(group->_M_dataplus)._M_p,__n), iVar4 == 0)
          ))) {
        if (tag->_M_string_length == 0) {
LAB_0010e8ae:
          std::vector<common::Host,_std::allocator<common::Host>_>::push_back
                    (hosts,(this->m_hosts).
                           super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar8].
                           super___shared_ptr<common::Host,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          iVar5 = iVar5 + 1;
        }
        else {
          __it._M_current =
               (peVar1->tags).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = (peVar1->tags).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_38 = tag;
          if (__it._M_current != pbVar2) {
            lVar7 = 0;
            do {
              bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                                ((_Iter_equals_val<std::__cxx11::string_const> *)&local_38,__it);
              lVar7 = lVar7 + (ulong)bVar3;
              __it._M_current = __it._M_current + 1;
            } while (__it._M_current != pbVar2);
            if (lVar7 != 0) goto LAB_0010e8ae;
          }
        }
      }
      uVar8 = uVar8 + 1;
      psVar6 = (this->m_hosts).
               super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->m_hosts).
                                   super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4));
  }
  return iVar5;
}

Assistant:

int Config::GetHosts(const std::string& group, const std::string& tag, std::vector<Host>* hosts) {
    int num = 0;
    for (size_t i = 0; i < m_hosts.size(); i++) {
        if (m_hosts[i]->group == group) {
            std::vector<std::string>& v = m_hosts[i]->tags;
            if (tag.empty() || std::count(v.begin(), v.end(), tag) > 0) {
                hosts->push_back(*m_hosts[i]);
                num++;
            }
        }
    }
    return num;
}